

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

iterator * __thiscall
csv::CSVRow::iterator::operator++(iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  int param_1_local;
  iterator *this_local;
  iterator *temp;
  
  iterator(__return_storage_ptr__,this);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVRow::iterator CSVRow::iterator::operator++(int) {
        // Post-increment operator
        auto temp = *this;
        this->operator++();
        return temp;
    }